

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::FlushBackgroundPages
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this)

{
  uint pageCount_00;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment_00;
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  DWORD DVar5;
  FreePageEntry *__s;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList_00;
  HANDLE pVVar6;
  ThreadContextId pvVar7;
  undefined8 *in_FS_OFFSET;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList;
  uint pageCount;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment;
  FreePageEntry *freePageEntry;
  uint newFreePages;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  uVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x732,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->backgroundPageQueue == (BackgroundPageQueue *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x733,"(backgroundPageQueue)","backgroundPageQueue");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  freePageEntry._4_4_ = 0;
  do {
    __s = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
    if (__s == (FreePageEntry *)0x0) {
      LogFreePages(this,(ulong)freePageEntry._4_4_);
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if ((bVar3) && ((this->pageAllocatorFlagTable->Verbose & 1U) != 0)) {
        pvVar7 = GetCurrentThreadContextId();
        DVar5 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar7,(ulong)DVar5,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"New free pages: %d\n",(ulong)freePageEntry._4_4_);
        Output::Print(L"\n");
        Output::Flush();
      }
      AddFreePageCount(this,freePageEntry._4_4_);
      return;
    }
    segment_00 = __s->segment;
    pageCount_00 = __s->pageCount;
    fromSegmentList_00 = GetSegmentList(this,segment_00);
    if (fromSegmentList_00 ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x745,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    pVVar1 = this->processHandle;
    pVVar6 = GetCurrentProcess();
    if (pVVar1 != pVVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x747,"(this->processHandle == GetCurrentProcess())",
                         "this->processHandle == GetCurrentProcess()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    memset(__s,0,0x18);
    PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages(segment_00,__s,pageCount_00);
    freePageEntry._4_4_ = pageCount_00 + freePageEntry._4_4_;
    TransferSegment(this,segment_00,fromSegmentList_00);
  } while( true );
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::FlushBackgroundPages()
{
    Assert(!this->HasMultiThreadAccess());
    Assert(backgroundPageQueue);

    // We can have additional pages queued up to be zeroed out here
    // and that's okay since they'll eventually be zeroed out before being flushed

    uint newFreePages = 0;

    while (true)
    {
        FreePageEntry * freePageEntry = backgroundPageQueue->PopFreePageEntry();
        if (freePageEntry == nullptr)
        {
            break;
        }
        TPageSegment * segment = freePageEntry->segment;
        uint pageCount = freePageEntry->pageCount;

        DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
        Assert(fromSegmentList != nullptr);

        Assert(this->processHandle == GetCurrentProcess());
        memset(freePageEntry, 0, sizeof(FreePageEntry));

        segment->ReleasePages(freePageEntry, pageCount);
        newFreePages += pageCount;

        TransferSegment(segment, fromSegmentList);
    }

    LogFreePages(newFreePages);

    PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
    this->AddFreePageCount(newFreePages);
}